

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O0

spv_result_t spvtools::val::CheckIdDefinitionDominateUse(ValidationState_t *_)

{
  __node_base_ptr *this;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *this_00;
  reference this_01;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *pvVar4;
  BasicBlock *other;
  Instruction *pIVar5;
  reference ppVar6;
  Function *pFVar7;
  reference ppIVar8;
  BasicBlock *pBVar9;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_02;
  Instruction *pIVar10;
  Function *pFVar11;
  DiagnosticStream *pDVar12;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar13;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar14;
  string local_828;
  string local_808;
  string local_7e8;
  DiagnosticStream local_7c8;
  BasicBlock *local_5f0;
  undefined1 local_5e8;
  BasicBlock *local_5e0;
  undefined1 local_5d8;
  BasicBlock *local_5d0;
  BasicBlock *parent;
  Instruction *variable;
  size_t i;
  Instruction *phi;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  *__range2_1;
  string local_578;
  string local_558;
  DiagnosticStream local_538;
  Instruction *local_360;
  Instruction *user;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> use_1;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range5_1;
  string local_328;
  string local_308;
  string local_2e8;
  DiagnosticStream local_2c8;
  _Node_iterator_base<unsigned_int,_false> local_f0;
  undefined1 local_e8;
  uint32_t local_dc;
  _Node_iterator_base<unsigned_int,_false> local_d8;
  undefined1 local_d0;
  BasicBlock *local_c8;
  BasicBlock *use_block;
  Instruction *use;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *use_index_pair;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range5;
  BasicBlock *block;
  Function *func;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  phi_ids;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  phi_instructions;
  ValidationState_t *__local;
  
  std::
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>::
  vector((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
          *)&phi_ids._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  this_00 = ValidationState_t::ordered_instructions(_);
  __end2 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
           begin(this_00);
  inst = (Instruction *)
         std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::end
                   (this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                *)&inst);
    if (!bVar1) {
      this = &phi_ids._M_h._M_single_bucket;
      __end2_1 = std::
                 vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                 ::begin((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                          *)this);
      phi = (Instruction *)
            std::
            vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
            ::end((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                   *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_spvtools::val::Instruction_**,_std::vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>_>
                                 *)&phi), bVar1) {
        ppIVar8 = __gnu_cxx::
                  __normal_iterator<const_spvtools::val::Instruction_**,_std::vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>_>
                  ::operator*(&__end2_1);
        i = (size_t)*ppIVar8;
        pBVar9 = Instruction::block((Instruction *)i);
        bVar1 = BasicBlock::reachable(pBVar9);
        if (bVar1) {
          variable = (Instruction *)0x3;
          while( true ) {
            pIVar5 = variable;
            this_02 = Instruction::operands((Instruction *)i);
            pIVar10 = (Instruction *)
                      std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                                (this_02);
            if (pIVar10 <= pIVar5) break;
            uVar3 = Instruction::word((Instruction *)i,(size_t)variable);
            parent = (BasicBlock *)ValidationState_t::FindDef(_,uVar3);
            pFVar11 = Instruction::function((Instruction *)i);
            uVar3 = Instruction::word((Instruction *)i,
                                      (size_t)((long)&(variable->words_).
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1));
            pVar14 = Function::GetBlock(pFVar11,uVar3);
            local_5f0 = pVar14.first;
            local_5e8 = pVar14.second;
            local_5e0 = local_5f0;
            local_5d8 = local_5e8;
            local_5d0 = local_5f0;
            pBVar9 = Instruction::block((Instruction *)parent);
            if ((pBVar9 != (BasicBlock *)0x0) && (bVar1 = BasicBlock::reachable(local_5d0), bVar1))
            {
              pBVar9 = Instruction::block((Instruction *)parent);
              bVar1 = BasicBlock::dominates(pBVar9,local_5d0);
              if (!bVar1) {
                ValidationState_t::diag(&local_7c8,_,SPV_ERROR_INVALID_ID,(Instruction *)i);
                pDVar12 = DiagnosticStream::operator<<
                                    (&local_7c8,(char (*) [22])"In OpPhi instruction ");
                uVar3 = Instruction::id((Instruction *)i);
                ValidationState_t::getIdName_abi_cxx11_(&local_7e8,_,uVar3);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_7e8);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,(char (*) [6])", ID ");
                uVar3 = Instruction::id((Instruction *)parent);
                ValidationState_t::getIdName_abi_cxx11_(&local_808,_,uVar3);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_808);
                pDVar12 = DiagnosticStream::operator<<
                                    (pDVar12,(char (*) [42])
                                             " definition does not dominate its parent ");
                uVar3 = BasicBlock::id(local_5d0);
                ValidationState_t::getIdName_abi_cxx11_(&local_828,_,uVar3);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_828);
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar12);
                std::__cxx11::string::~string((string *)&local_828);
                std::__cxx11::string::~string((string *)&local_808);
                std::__cxx11::string::~string((string *)&local_7e8);
                DiagnosticStream::~DiagnosticStream(&local_7c8);
                goto LAB_00b94139;
              }
            }
            variable = (Instruction *)
                       ((long)&(variable->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 2);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_spvtools::val::Instruction_**,_std::vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>_>
        ::operator++(&__end2_1);
      }
      __local._4_4_ = SPV_SUCCESS;
LAB_00b94139:
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2);
      std::
      vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
      ::~vector((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                 *)&phi_ids._M_h._M_single_bucket);
      return __local._4_4_;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
              ::operator*(&__end2);
    uVar3 = Instruction::id(this_01);
    if ((uVar3 != 0) && (pFVar11 = Instruction::function(this_01), pFVar11 != (Function *)0x0)) {
      pBVar9 = Instruction::block(this_01);
      if (pBVar9 == (BasicBlock *)0x0) {
        pvVar4 = Instruction::uses(this_01);
        __end5_1 = std::
                   vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ::begin(pvVar4);
        use_1._8_8_ = std::
                      vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ::end(pvVar4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5_1,
                                  (__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                   *)&use_1.second), bVar1) {
          ppVar6 = __gnu_cxx::
                   __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                   ::operator*(&__end5_1);
          local_360 = ppVar6->first;
          use_1.first = *(Instruction **)&ppVar6->second;
          user = local_360;
          pFVar7 = Instruction::function(local_360);
          if ((pFVar7 != (Function *)0x0) &&
             (pFVar7 = Instruction::function(local_360), pFVar7 != pFVar11)) {
            uVar3 = Function::id(pFVar11);
            pIVar5 = ValidationState_t::FindDef(_,uVar3);
            ValidationState_t::diag(&local_538,_,SPV_ERROR_INVALID_ID,pIVar5);
            pDVar12 = DiagnosticStream::operator<<(&local_538,(char (*) [4])0xd227b3);
            uVar3 = Instruction::id(this_01);
            ValidationState_t::getIdName_abi_cxx11_(&local_558,_,uVar3);
            pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_558);
            pDVar12 = DiagnosticStream::operator<<(pDVar12,(char (*) [19])" used in function ");
            pFVar7 = Instruction::function(local_360);
            uVar3 = Function::id(pFVar7);
            ValidationState_t::getIdName_abi_cxx11_(&local_578,_,uVar3);
            pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_578);
            pDVar12 = DiagnosticStream::operator<<
                                (pDVar12,(char (*) [44])
                                         " is used outside of it\'s defining function ");
            uVar3 = Function::id(pFVar11);
            ValidationState_t::getIdName_abi_cxx11_((string *)&__range2_1,_,uVar3);
            pDVar12 = DiagnosticStream::operator<<
                                (pDVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&__range2_1);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar12);
            std::__cxx11::string::~string((string *)&__range2_1);
            std::__cxx11::string::~string((string *)&local_578);
            std::__cxx11::string::~string((string *)&local_558);
            DiagnosticStream::~DiagnosticStream(&local_538);
            goto LAB_00b94139;
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
          ::operator++(&__end5_1);
        }
      }
      else {
        pvVar4 = Instruction::uses(this_01);
        __end5 = std::
                 vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                 ::begin(pvVar4);
        use_index_pair =
             (pair<const_spvtools::val::Instruction_*,_unsigned_int> *)
             std::
             vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ::end(pvVar4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                           *)&use_index_pair), bVar1) {
          use = (Instruction *)
                __gnu_cxx::
                __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                ::operator*(&__end5);
          use_block = (BasicBlock *)
                      (use->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_c8 = Instruction::block((Instruction *)use_block);
          if ((local_c8 != (BasicBlock *)0x0) && (bVar1 = BasicBlock::reachable(local_c8), bVar1)) {
            OVar2 = Instruction::opcode((Instruction *)use_block);
            if (OVar2 == OpPhi) {
              local_dc = Instruction::id((Instruction *)use_block);
              pVar13 = std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&__range2,&local_dc);
              local_f0._M_cur =
                   (__node_type *)pVar13.first.super__Node_iterator_base<unsigned_int,_false>._M_cur
              ;
              local_e8 = pVar13.second;
              local_d8._M_cur = local_f0._M_cur;
              local_d0 = local_e8;
              if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::
                vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                ::push_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                             *)&phi_ids._M_h._M_single_bucket,(value_type *)&use_block);
              }
            }
            else {
              other = Instruction::block((Instruction *)use_block);
              bVar1 = BasicBlock::dominates(pBVar9,other);
              if (!bVar1) {
                pIVar5 = BasicBlock::label(local_c8);
                ValidationState_t::diag(&local_2c8,_,SPV_ERROR_INVALID_ID,pIVar5);
                pDVar12 = DiagnosticStream::operator<<(&local_2c8,(char (*) [4])0xd227b3);
                uVar3 = Instruction::id(this_01);
                ValidationState_t::getIdName_abi_cxx11_(&local_2e8,_,uVar3);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_2e8);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,(char (*) [19])" defined in block ");
                uVar3 = BasicBlock::id(pBVar9);
                ValidationState_t::getIdName_abi_cxx11_(&local_308,_,uVar3);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_308);
                pDVar12 = DiagnosticStream::operator<<
                                    (pDVar12,(char (*) [37])" does not dominate its use in block ");
                uVar3 = BasicBlock::id(local_c8);
                ValidationState_t::getIdName_abi_cxx11_(&local_328,_,uVar3);
                pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_328);
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar12);
                std::__cxx11::string::~string((string *)&local_328);
                std::__cxx11::string::~string((string *)&local_308);
                std::__cxx11::string::~string((string *)&local_2e8);
                DiagnosticStream::~DiagnosticStream(&local_2c8);
                goto LAB_00b94139;
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
          ::operator++(&__end5);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t CheckIdDefinitionDominateUse(ValidationState_t& _) {
  std::vector<const Instruction*> phi_instructions;
  std::unordered_set<uint32_t> phi_ids;
  for (const auto& inst : _.ordered_instructions()) {
    if (inst.id() == 0) continue;
    if (const Function* func = inst.function()) {
      if (const BasicBlock* block = inst.block()) {
        // If the Id is defined within a block then make sure all references to
        // that Id appear in a blocks that are dominated by the defining block
        for (auto& use_index_pair : inst.uses()) {
          const Instruction* use = use_index_pair.first;
          if (const BasicBlock* use_block = use->block()) {
            if (use_block->reachable() == false) continue;
            if (use->opcode() == spv::Op::OpPhi) {
              if (phi_ids.insert(use->id()).second) {
                phi_instructions.push_back(use);
              }
            } else if (!block->dominates(*use->block())) {
              return _.diag(SPV_ERROR_INVALID_ID, use_block->label())
                     << "ID " << _.getIdName(inst.id()) << " defined in block "
                     << _.getIdName(block->id())
                     << " does not dominate its use in block "
                     << _.getIdName(use_block->id());
            }
          }
        }
      } else {
        // If the Ids defined within a function but not in a block(i.e. function
        // parameters, block ids), then make sure all references to that Id
        // appear within the same function
        for (auto use : inst.uses()) {
          const Instruction* user = use.first;
          if (user->function() && user->function() != func) {
            return _.diag(SPV_ERROR_INVALID_ID, _.FindDef(func->id()))
                   << "ID " << _.getIdName(inst.id()) << " used in function "
                   << _.getIdName(user->function()->id())
                   << " is used outside of it's defining function "
                   << _.getIdName(func->id());
          }
        }
      }
    }
    // NOTE: Ids defined outside of functions must appear before they are used
    // This check is being performed in the IdPass function
  }

  // Check all OpPhi parent blocks are dominated by the variable's defining
  // blocks
  for (const Instruction* phi : phi_instructions) {
    if (phi->block()->reachable() == false) continue;
    for (size_t i = 3; i < phi->operands().size(); i += 2) {
      const Instruction* variable = _.FindDef(phi->word(i));
      const BasicBlock* parent =
          phi->function()->GetBlock(phi->word(i + 1)).first;
      if (variable->block() && parent->reachable() &&
          !variable->block()->dominates(*parent)) {
        return _.diag(SPV_ERROR_INVALID_ID, phi)
               << "In OpPhi instruction " << _.getIdName(phi->id()) << ", ID "
               << _.getIdName(variable->id())
               << " definition does not dominate its parent "
               << _.getIdName(parent->id());
      }
    }
  }

  return SPV_SUCCESS;
}